

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O1

icu_std_converter<wchar_t,_4> * __thiscall
booster::locale::impl_icu::icu_std_converter<wchar_t,_4>::icu_checked
          (icu_std_converter<wchar_t,_4> *this,char_type_conflict *begin,char_type_conflict *end)

{
  uint uVar1;
  uint *in_RCX;
  
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)this,(int)((ulong)((long)in_RCX - (long)end) >> 2),0,0);
  if (in_RCX != (uint *)end) {
    do {
      uVar1 = *end;
      if ((uVar1 < 0xd800) ||
         ((uVar1 - 0xe000 < 0x102000 &&
          (((int)uVar1 < 0xfdd0 || ((~uVar1 & 0xfffe) != 0 && 0xfdef < (int)uVar1)))))) {
        icu_70::UnicodeString::append((int)this);
      }
      else {
        throw_if_needed((icu_std_converter<wchar_t,_4> *)begin);
      }
      end = (char_type_conflict *)((uint *)end + 1);
    } while ((uint *)end != in_RCX);
  }
  return this;
}

Assistant:

icu::UnicodeString icu_checked(char_type const *begin,char_type const *end) const
        {
            icu::UnicodeString tmp(end-begin,0,0); // make inital capacity
            while(begin!=end) {
                UChar32 c = static_cast<UChar32>(*begin++);
                if(U_IS_UNICODE_CHAR(c))
                        tmp.append(c);
                else
                    throw_if_needed();
            }
            return tmp;
        }